

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TomlProcessingFunctions.hpp
# Opt level: O1

bool helics::fileops::callIfMember
               (value *element,string *key,
               function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_TimeRepresentation<count_time<9,_long>_>)>
               *call)

{
  enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_> *v;
  enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_> val;
  value uval;
  TimeRepresentation<count_time<9,_long>_> local_1c0;
  basic_value<toml::type_config> local_1b8;
  basic_value<toml::type_config> local_f0;
  
  toml::basic_value<toml::type_config>::basic_value(&local_f0);
  v = toml::find_or<toml::type_config,std::__cxx11::string>
                (element,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)key,
                 &local_f0);
  toml::basic_value<toml::type_config>::basic_value(&local_1b8,v);
  if (local_1b8.type_ != empty) {
    local_1c0.internalTimeCode = (baseType)loadTomlTime(&local_1b8,sec);
    if ((call->super__Function_base)._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    (*call->_M_invoker)((_Any_data *)call,key,&local_1c0);
    v = (enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_> *)key;
  }
  toml::basic_value<toml::type_config>::cleanup(&local_1b8,(EVP_PKEY_CTX *)v);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_1b8.comments_);
  toml::detail::region::~region(&local_1b8.region_);
  toml::basic_value<toml::type_config>::cleanup(&local_f0,(EVP_PKEY_CTX *)v);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_f0.comments_);
  toml::detail::region::~region(&local_f0.region_);
  return local_1b8.type_ != empty;
}

Assistant:

inline bool callIfMember(const toml::value& element,
                         const std::string& key,
                         const std::function<void(const std::string&, helics::Time)>& call)
{
    toml::value uval;
    auto val = toml::find_or(element, key, uval);

    if (!val.is_empty()) {
        call(key, loadTomlTime(val));
        return true;
    }
    return false;
}